

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

Normal3f __thiscall
pbrt::AnimatedTransform::operator()(AnimatedTransform *this,Normal3f *n,Float time)

{
  float fVar1;
  undefined1 auVar3 [16];
  undefined8 uVar2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Normal3f NVar19;
  Transform t;
  Transform local_90;
  
  if ((this->actuallyAnimated != true) || (time <= this->startTime)) {
    fVar6 = (n->super_Tuple3<pbrt::Normal3,_float>).y;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)(this->startTransform).mInv.m[0];
    uVar2 = *(undefined8 *)(this->startTransform).mInv.m[1];
    auVar4._0_4_ = fVar6 * (float)uVar2;
    auVar4._4_4_ = fVar6 * (float)((ulong)uVar2 >> 0x20);
    auVar4._8_4_ = fVar6 * 0.0;
    auVar4._12_4_ = fVar6 * 0.0;
    fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).x;
    auVar14._4_4_ = fVar1;
    auVar14._0_4_ = fVar1;
    auVar14._8_4_ = fVar1;
    auVar14._12_4_ = fVar1;
    fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).z;
    auVar17._4_4_ = fVar1;
    auVar17._0_4_ = fVar1;
    auVar17._8_4_ = fVar1;
    auVar17._12_4_ = fVar1;
    auVar4 = vfmadd231ps_fma(auVar4,auVar14,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)(this->startTransform).mInv.m[2];
    auVar4 = vfmadd231ps_fma(auVar4,auVar17,auVar10);
    uVar2 = auVar4._0_8_;
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->startTransform).mInv.m[1][2])),auVar14,
                             ZEXT416((uint)(this->startTransform).mInv.m[0][2]));
    auVar4 = vfmadd231ss_fma(auVar4,auVar17,ZEXT416((uint)(this->startTransform).mInv.m[2][2]));
    fVar6 = auVar4._0_4_;
  }
  else if (this->endTime <= time) {
    fVar6 = (n->super_Tuple3<pbrt::Normal3,_float>).y;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)(this->endTransform).mInv.m[0];
    uVar2 = *(undefined8 *)(this->endTransform).mInv.m[1];
    auVar5._0_4_ = fVar6 * (float)uVar2;
    auVar5._4_4_ = fVar6 * (float)((ulong)uVar2 >> 0x20);
    auVar5._8_4_ = fVar6 * 0.0;
    auVar5._12_4_ = fVar6 * 0.0;
    fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).x;
    auVar15._4_4_ = fVar1;
    auVar15._0_4_ = fVar1;
    auVar15._8_4_ = fVar1;
    auVar15._12_4_ = fVar1;
    fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).z;
    auVar18._4_4_ = fVar1;
    auVar18._0_4_ = fVar1;
    auVar18._8_4_ = fVar1;
    auVar18._12_4_ = fVar1;
    auVar4 = vfmadd231ps_fma(auVar5,auVar15,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)(this->endTransform).mInv.m[2];
    auVar4 = vfmadd231ps_fma(auVar4,auVar18,auVar12);
    uVar2 = auVar4._0_8_;
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->endTransform).mInv.m[1][2])),auVar15,
                             ZEXT416((uint)(this->endTransform).mInv.m[0][2]));
    auVar4 = vfmadd231ss_fma(auVar4,auVar18,ZEXT416((uint)(this->endTransform).mInv.m[2][2]));
    fVar6 = auVar4._0_4_;
  }
  else {
    Interpolate(&local_90,this,time);
    fVar6 = (n->super_Tuple3<pbrt::Normal3,_float>).y;
    auVar7._8_8_ = 0;
    auVar7._0_4_ = local_90.mInv.m[0][0];
    auVar7._4_4_ = local_90.mInv.m[0][1];
    auVar3._0_4_ = fVar6 * local_90.mInv.m[1][0];
    auVar3._4_4_ = fVar6 * local_90.mInv.m[1][1];
    auVar3._8_4_ = fVar6 * 0.0;
    auVar3._12_4_ = fVar6 * 0.0;
    fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).x;
    auVar13._4_4_ = fVar1;
    auVar13._0_4_ = fVar1;
    auVar13._8_4_ = fVar1;
    auVar13._12_4_ = fVar1;
    fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).z;
    auVar16._4_4_ = fVar1;
    auVar16._0_4_ = fVar1;
    auVar16._8_4_ = fVar1;
    auVar16._12_4_ = fVar1;
    auVar4 = vfmadd231ps_fma(auVar3,auVar13,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_4_ = local_90.mInv.m[2][0];
    auVar8._4_4_ = local_90.mInv.m[2][1];
    auVar4 = vfmadd231ps_fma(auVar4,auVar16,auVar8);
    uVar2 = auVar4._0_8_;
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * local_90.mInv.m[1][2])),auVar13,
                             ZEXT416((uint)local_90.mInv.m[0][2]));
    auVar4 = vfmadd231ss_fma(auVar4,auVar16,ZEXT416((uint)local_90.mInv.m[2][2]));
    fVar6 = auVar4._0_4_;
  }
  NVar19.super_Tuple3<pbrt::Normal3,_float>.z = fVar6;
  NVar19.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar2;
  NVar19.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
  return (Normal3f)NVar19.super_Tuple3<pbrt::Normal3,_float>;
}

Assistant:

Normal3f AnimatedTransform::operator()(const Normal3f &n, Float time) const {
    if (!actuallyAnimated || time <= startTime)
        return startTransform(n);
    else if (time >= endTime)
        return endTransform(n);
    Transform t = Interpolate(time);
    return t(n);
}